

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O1

void __thiscall Bstrlib::CBString::setsubstr(CBString *this,int pos,char *s,uchar cfill)

{
  int iVar1;
  size_t sVar2;
  CBStringException *pCVar3;
  CBStringException bstr__cppwrapper_exception;
  tagbstring t;
  string local_98;
  string local_78;
  CBStringException local_58;
  tagbstring local_30;
  
  if (s == (char *)0x0) {
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,"CBString::setsubstr NULL.","");
    CBStringException::CBStringException(&local_58,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    pCVar3 = (CBStringException *)__cxa_allocate_exception(0x28);
    CBStringException::CBStringException(pCVar3,&local_58);
    __cxa_throw(pCVar3,&CBStringException::typeinfo,CBStringException::~CBStringException);
  }
  local_30.data = (uchar *)s;
  sVar2 = strlen(s);
  local_30.slen = (int)sVar2;
  local_30.mlen = -1;
  iVar1 = bsetstr(&this->super_tagbstring,pos,&local_30,cfill);
  if (iVar1 != -1) {
    return;
  }
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,"CBString::Failure in setsubstr","");
  CBStringException::CBStringException(&local_58,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  pCVar3 = (CBStringException *)__cxa_allocate_exception(0x28);
  CBStringException::CBStringException(pCVar3,&local_58);
  __cxa_throw(pCVar3,&CBStringException::typeinfo,CBStringException::~CBStringException);
}

Assistant:

void CBString::setsubstr (int pos, const char * s, unsigned char cfill) {
struct tagbstring t;
	if (NULL == s) {
#ifdef BSTRLIB_THROWS_EXCEPTIONS
		bstringThrow ("setsubstr NULL.");
#else
		return;
#endif
	}
	cstr2tbstr (t, s);
	if (BSTR_ERR == bsetstr (this, pos, &t, cfill)) {
		bstringThrow ("Failure in setsubstr");
	}
}